

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O3

void StrToNumVectorHelper<std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>
               (string *source,vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *dest
               ,value_type_conflict5 *def)

{
  unsigned_long_long *puVar1;
  istream *piVar2;
  iterator iVar3;
  double dVar4;
  string item;
  stringstream ss;
  ulong local_1e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  long local_1d0;
  char local_1c8 [16];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  puVar1 = *(unsigned_long_long **)dest;
  iVar3._M_current = *(unsigned_long_long **)(dest + 8);
  if (*(unsigned_long_long **)(dest + 8) != puVar1) {
    *(unsigned_long_long **)(dest + 8) = puVar1;
    iVar3._M_current = puVar1;
  }
  if (source->_M_string_length == 0) {
    if (iVar3._M_current == *(unsigned_long_long **)(dest + 0x10)) {
      std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
      _M_realloc_insert<unsigned_long_long_const&>
                ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)dest,iVar3,def);
      return;
    }
    *iVar3._M_current = *def;
    *(unsigned_long_long **)(dest + 8) = iVar3._M_current + 1;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8,(string *)source,_S_out|_S_in);
    local_1d0 = 0;
    local_1c8[0] = '\0';
    local_1d8._M_current = local_1c8;
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b8,(string *)&local_1d8,',');
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      local_1e0 = CONCAT71(local_1e0._1_7_,0x20);
      std::
      __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                (local_1d8,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(local_1d8._M_current + local_1d0),(_Iter_equals_val<const_char>)&local_1e0);
      dVar4 = strtod(local_1d8._M_current,(char **)0x0);
      local_1e0 = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
      iVar3._M_current = *(unsigned_long_long **)(dest + 8);
      if (iVar3._M_current == *(unsigned_long_long **)(dest + 0x10)) {
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
        _M_realloc_insert<unsigned_long_long>(dest,iVar3,&local_1e0);
      }
      else {
        *iVar3._M_current = local_1e0;
        *(unsigned_long_long **)(dest + 8) = iVar3._M_current + 1;
      }
    }
    iVar3._M_current = *(unsigned_long_long **)(dest + 8);
    if (*(unsigned_long_long **)dest == iVar3._M_current) {
      if (*(unsigned_long_long **)dest == *(unsigned_long_long **)(dest + 0x10)) {
        std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
        _M_realloc_insert<unsigned_long_long_const&>
                  ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)dest,iVar3,def);
      }
      else {
        *iVar3._M_current = *def;
        *(unsigned_long_long **)(dest + 8) = iVar3._M_current + 1;
      }
    }
    if (local_1d8._M_current != local_1c8) {
      operator_delete(local_1d8._M_current);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

inline void StrToNumVectorHelper(const std::string &source, TList &dest, const typename TList::value_type &def)
{
    typedef typename TList::value_type T;
    dest.clear();

    if(!source.empty())
    {
        std::stringstream ss(source);
        std::string item;
        while(std::getline(ss, item, ','))
        {
            auto remove_ret = std::remove(item.begin(), item.end(), ' '); //-V530
            (void)remove_ret;

            try
            {
                if(std::is_same<T, int>::value ||
                   std::is_same<T, long>::value ||
                   std::is_same<T, short>::value)
                    dest.push_back(static_cast<T>(std::strtol(item.c_str(), NULL, 0)));
                else if(std::is_same<T, unsigned int>::value ||
                        std::is_same<T, unsigned long>::value ||
                        std::is_same<T, unsigned short>::value)
                    dest.push_back(static_cast<T>(std::strtoul(item.c_str(), NULL, 0)));
                else if(std::is_same<T, float>::value)
                    dest.push_back(std::strtof(item.c_str(), NULL));
                else
                    dest.push_back(std::strtod(item.c_str(), NULL));
            }
            catch(...)
            {
                dest.pop_back();
            }
        }

        if(dest.empty())
            dest.push_back(def);
    }
    else
        dest.push_back(def);
}